

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.hpp
# Opt level: O1

void __thiscall
crawler::Node::Node(Node *this,string *_name,AttrMap *_attrMap,
                   vector<crawler::Node,_std::allocator<crawler::Node>_> *_children,
                   shared_ptr<crawler::Node> *_parent)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  pointer pcVar5;
  AttrMap *pAVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  ElementData local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   &(this->nodeData).
    super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>._M_u = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> + 8
   ) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x10) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x18) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x20) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x28) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x30) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x38) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x40) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x48) = 0;
  *(undefined1 **)
   &(this->nodeData).
    super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>._M_u =
       (undefined1 *)
       ((long)&(this->nodeData).
               super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
       + 0x10);
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> + 8
   ) = 0;
  *(undefined1 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x10) = 0;
  puVar1 = (undefined1 *)
           ((long)&(this->nodeData).
                   super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
                   .super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
                   super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
                   super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
           + 0x28);
  *(undefined4 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x28) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x30) = 0;
  *(undefined1 **)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x38) = puVar1;
  *(undefined1 **)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x40) = puVar1;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x48) = 0;
  *(__index_type *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x50) = '\0';
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::_M_move_assign
            (&this->children,_children);
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  pcVar5 = (_name->_M_dataplus)._M_p;
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar5,pcVar5 + _name->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&_attrMap->_M_t);
  paVar2 = &local_b0.tagName.field_2;
  if (local_d0 == &local_c0) {
    local_b0.tagName.field_2._8_8_ = local_c0._8_8_;
    local_b0.tagName._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.tagName._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.tagName.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_b0.tagName.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  p_Var3 = &local_b0.attributes._M_t._M_impl.super__Rb_tree_header;
  local_b0.tagName._M_string_length = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    pAVar6 = &local_b0.attributes;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  else {
    p_Var4 = &local_60._M_impl.super__Rb_tree_header;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
    pAVar6 = (AttrMap *)&local_60._M_impl;
    local_b0.attributes._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  }
  *(size_t *)((long)&(pAVar6->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
  local_d0 = &local_c0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
  }
  this->nodeType = Element;
  std::variant<crawler::ElementData,std::__cxx11::string>::operator=
            ((variant<crawler::ElementData,std::__cxx11::string> *)&this->nodeData,&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0.attributes._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.tagName._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.tagName._M_dataplus._M_p,
                    local_b0.tagName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Node(const std::string &_name, const AttrMap &_attrMap,
                std::vector<Node> _children,
                const std::shared_ptr<Node> &_parent) {
    children = std::move(_children);
    parent = _parent;
    ElementData elementData(_name, _attrMap);
    nodeType = NodeType::Element;
    nodeData = elementData;
  }